

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int CVodeSetJacTimesRhsFn(void *cvode_mem,CVRhsFn jtimesRhsFn)

{
  long in_RSI;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  CVodeMem local_20;
  int local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffd8,
                            (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8,(CVLsMem *)0xefced9);
  if (local_4 == 0) {
    if (*(int *)((long)in_stack_ffffffffffffffd8 + 0xf0) == 0) {
      cvProcessError(local_20,-3,"CVLS","CVodeSetJacTimesRhsFn",
                     "Internal finite-difference Jacobian-vector product is disabled.");
      local_4 = -3;
    }
    else {
      if (in_RSI == 0) {
        *(CVRhsFn *)((long)in_stack_ffffffffffffffd8 + 0x108) = local_20->cv_f;
      }
      else {
        *(long *)((long)in_stack_ffffffffffffffd8 + 0x108) = in_RSI;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CVodeSetJacTimesRhsFn(void *cvode_mem, CVRhsFn jtimesRhsFn)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  int      retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, "CVodeSetJacTimesRhsFn",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) return(retval);

  /* check if using internal finite difference approximation */
  if (!(cvls_mem->jtimesDQ)) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS", "CVodeSetJacTimesRhsFn",
                   "Internal finite-difference Jacobian-vector product is disabled.");
    return(CVLS_ILL_INPUT);
  }

  /* store function pointers for RHS function (NULL implies use ODE RHS) */
  if (jtimesRhsFn != NULL)
    cvls_mem->jt_f = jtimesRhsFn;
  else
    cvls_mem->jt_f = cv_mem->cv_f;

  return(CVLS_SUCCESS);
}